

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

aiMesh * Assimp::StandardShapes::MakeMesh
                   (_func_uint_vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_ptr_bool
                    *GenerateFunc)

{
  uint numIndices;
  aiMesh *paVar1;
  undefined1 local_28 [4];
  uint num;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp;
  _func_uint_vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_ptr_bool
  *GenerateFunc_local;
  
  temp.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)GenerateFunc;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_28);
  numIndices = (*(code *)temp.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_28
                          ,1);
  paVar1 = MakeMesh((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_28,
                    numIndices);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_28);
  return paVar1;
}

Assistant:

aiMesh* StandardShapes::MakeMesh ( unsigned int (*GenerateFunc)(
    std::vector<aiVector3D>&, bool))
{
    std::vector<aiVector3D> temp;
    unsigned num = (*GenerateFunc)(temp,true);
    return MakeMesh(temp,num);
}